

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O3

void __thiscall
lf::refinement::MeshHierarchy::MeshHierarchy
          (MeshHierarchy *this,shared_ptr<lf::mesh::Mesh> *base_mesh,
          unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
          *mesh_factory)

{
  vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
  *this_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_01;
  element_type *peVar1;
  Entity *T;
  vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
  *this_02;
  int iVar2;
  uint uVar3;
  int iVar4;
  sub_idx_t sVar5;
  undefined4 extraout_var;
  runtime_error *prVar6;
  long extraout_RDX;
  long lVar7;
  vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
  point_child_info;
  vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
  edge_child_info;
  vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> point_parent_info;
  stringstream ss;
  string local_258;
  string local_238;
  string local_218;
  MeshHierarchy *local_1f8;
  vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
  *local_1f0;
  vector<std::array<std::vector<lf::refinement::ParentInfo,std::allocator<lf::refinement::ParentInfo>>,3ul>,std::allocator<std::array<std::vector<lf::refinement::ParentInfo,std::allocator<lf::refinement::ParentInfo>>,3ul>>>
  *local_1e8;
  vector<std::vector<lf::refinement::PointChildInfo,std::allocator<lf::refinement::PointChildInfo>>,std::allocator<std::vector<lf::refinement::PointChildInfo,std::allocator<lf::refinement::PointChildInfo>>>>
  *local_1e0;
  vector<std::vector<lf::refinement::EdgeChildInfo,std::allocator<lf::refinement::EdgeChildInfo>>,std::allocator<std::vector<lf::refinement::EdgeChildInfo,std::allocator<lf::refinement::EdgeChildInfo>>>>
  *local_1d8;
  vector<std::vector<lf::refinement::CellChildInfo,std::allocator<lf::refinement::CellChildInfo>>,std::allocator<std::vector<lf::refinement::CellChildInfo,std::allocator<lf::refinement::CellChildInfo>>>>
  *local_1d0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_1c8;
  vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
  *local_1c0;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  pointer local_1a0;
  pointer pPStack_198;
  pointer local_190;
  pointer local_188;
  pointer pPStack_180;
  pointer local_178;
  
  this->_vptr_MeshHierarchy = (_func_int **)&PTR__MeshHierarchy_00530068;
  this_00 = &this->meshes_;
  (this->meshes_).
  super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->meshes_).
  super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->meshes_).
  super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mesh_factory_)._M_t.
  super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl =
       (mesh_factory->_M_t).
       super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>.
       _M_t.
       super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
       super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
  (mesh_factory->_M_t).
  super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>._M_t.
  super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
  super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl = (MeshFactory *)0x0;
  local_1e0 = (vector<std::vector<lf::refinement::PointChildInfo,std::allocator<lf::refinement::PointChildInfo>>,std::allocator<std::vector<lf::refinement::PointChildInfo,std::allocator<lf::refinement::PointChildInfo>>>>
               *)&this->point_child_infos_;
  local_1d8 = (vector<std::vector<lf::refinement::EdgeChildInfo,std::allocator<lf::refinement::EdgeChildInfo>>,std::allocator<std::vector<lf::refinement::EdgeChildInfo,std::allocator<lf::refinement::EdgeChildInfo>>>>
               *)&this->edge_child_infos_;
  local_1d0 = (vector<std::vector<lf::refinement::CellChildInfo,std::allocator<lf::refinement::CellChildInfo>>,std::allocator<std::vector<lf::refinement::CellChildInfo,std::allocator<lf::refinement::CellChildInfo>>>>
               *)&this->cell_child_infos_;
  local_1e8 = (vector<std::array<std::vector<lf::refinement::ParentInfo,std::allocator<lf::refinement::ParentInfo>>,3ul>,std::allocator<std::array<std::vector<lf::refinement::ParentInfo,std::allocator<lf::refinement::ParentInfo>>,3ul>>>
               *)&this->parent_infos_;
  local_1f0 = (vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
               *)&this->edge_marked_;
  this_01 = &this->refinement_edges_;
  local_1f8 = this;
  memset(local_1e0,0,0x90);
  peVar1 = (base_mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1c8 = this_01;
  local_1c0 = this_00;
  if (peVar1 == (element_type *)0x0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"No valid mesh supplied",0x16);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"base_mesh","");
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_238,&local_258,0x25,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,
                      (ulong)(local_238.field_2._M_allocated_capacity + 1));
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"this code should not be reached");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (**peVar1->_vptr_Mesh)();
  if (iVar2 == 2) {
    std::vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
    ::push_back(this_00,base_mesh);
    peVar1 = (base_mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_1b8._0_4_ = (*peVar1->_vptr_Mesh[3])(peVar1,0);
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::emplace_back<unsigned_int,unsigned_int_const&>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)this_01,(uint *)local_1b8,&idx_nil);
    peVar1 = (base_mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar2 = (*peVar1->_vptr_Mesh[2])(peVar1,0);
    if (extraout_RDX != 0) {
      lVar7 = 0;
      do {
        T = *(Entity **)(CONCAT44(extraout_var,iVar2) + lVar7);
        peVar1 = (base_mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        uVar3 = (*peVar1->_vptr_Mesh[5])(peVar1,T);
        iVar4 = (*T->_vptr_Entity[4])(T);
        if ((char)iVar4 == '\x03') {
          sVar5 = LongestEdge(T);
          (local_1f8->refinement_edges_).
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] = sVar5;
        }
        lVar7 = lVar7 + 8;
      } while (extraout_RDX << 3 != lVar7);
    }
    peVar1 = (base_mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar3 = (*peVar1->_vptr_Mesh[3])(peVar1,0);
    std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>::
    vector((vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_> *)
           local_1b8,(ulong)uVar3,(allocator_type *)&local_238);
    peVar1 = (base_mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar3 = (*peVar1->_vptr_Mesh[3])(peVar1,1);
    std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>::
    vector((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_> *)
           &local_238,(ulong)uVar3,(allocator_type *)&local_258);
    peVar1 = (base_mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar3 = (*peVar1->_vptr_Mesh[3])(peVar1,2);
    std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>::
    vector((vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
            *)&local_258,(ulong)uVar3,(allocator_type *)&local_218);
    std::
    vector<std::vector<lf::refinement::CellChildInfo,std::allocator<lf::refinement::CellChildInfo>>,std::allocator<std::vector<lf::refinement::CellChildInfo,std::allocator<lf::refinement::CellChildInfo>>>>
    ::
    emplace_back<std::vector<lf::refinement::CellChildInfo,std::allocator<lf::refinement::CellChildInfo>>>
              (local_1d0,
               (vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
                *)local_1b8);
    std::
    vector<std::vector<lf::refinement::EdgeChildInfo,std::allocator<lf::refinement::EdgeChildInfo>>,std::allocator<std::vector<lf::refinement::EdgeChildInfo,std::allocator<lf::refinement::EdgeChildInfo>>>>
    ::
    emplace_back<std::vector<lf::refinement::EdgeChildInfo,std::allocator<lf::refinement::EdgeChildInfo>>>
              (local_1d8,
               (vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                *)&local_238);
    std::
    vector<std::vector<lf::refinement::PointChildInfo,std::allocator<lf::refinement::PointChildInfo>>,std::allocator<std::vector<lf::refinement::PointChildInfo,std::allocator<lf::refinement::PointChildInfo>>>>
    ::
    emplace_back<std::vector<lf::refinement::PointChildInfo,std::allocator<lf::refinement::PointChildInfo>>>
              (local_1e0,
               (vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                *)&local_258);
    if (local_258._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_258._M_dataplus._M_p,
                      local_258.field_2._M_allocated_capacity - (long)local_258._M_dataplus._M_p);
    }
    std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>::
    ~vector((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_> *
            )&local_238);
    std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>::
    ~vector((vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_> *
            )local_1b8);
    peVar1 = (base_mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar3 = (*peVar1->_vptr_Mesh[3])(peVar1,0);
    std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::vector
              ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
               &local_238,(ulong)uVar3,(allocator_type *)local_1b8);
    peVar1 = (base_mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar3 = (*peVar1->_vptr_Mesh[3])(peVar1,1);
    std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::vector
              ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
               &local_258,(ulong)uVar3,(allocator_type *)local_1b8);
    peVar1 = (base_mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar3 = (*peVar1->_vptr_Mesh[3])(peVar1,2);
    std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::vector
              ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
               &local_218,(ulong)uVar3,(allocator_type *)local_1b8);
    local_1b8._0_8_ = local_238._M_dataplus._M_p;
    local_1b8._8_8_ = local_238._M_string_length;
    local_1a8 = (pointer)local_238.field_2._M_allocated_capacity;
    local_238._M_dataplus._M_p = (pointer)0x0;
    local_238._M_string_length = 0;
    local_238.field_2._M_allocated_capacity = 0;
    local_1a0 = (pointer)local_258._M_dataplus._M_p;
    pPStack_198 = (pointer)local_258._M_string_length;
    local_190 = (pointer)local_258.field_2._M_allocated_capacity;
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    local_188 = (pointer)local_218._M_dataplus._M_p;
    pPStack_180 = (pointer)local_218._M_string_length;
    local_178 = (pointer)local_218.field_2._M_allocated_capacity;
    local_218._M_dataplus._M_p = (pointer)0x0;
    local_218._M_string_length = 0;
    local_218.field_2._M_allocated_capacity = 0;
    std::
    vector<std::array<std::vector<lf::refinement::ParentInfo,std::allocator<lf::refinement::ParentInfo>>,3ul>,std::allocator<std::array<std::vector<lf::refinement::ParentInfo,std::allocator<lf::refinement::ParentInfo>>,3ul>>>
    ::
    emplace_back<std::array<std::vector<lf::refinement::ParentInfo,std::allocator<lf::refinement::ParentInfo>>,3ul>>
              (local_1e8,
               (array<std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>,_3UL>
                *)local_1b8);
    lVar7 = 0x30;
    do {
      std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::~vector
                ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
                 (local_1b8 + lVar7));
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != -0x18);
    std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::~vector
              ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
               &local_218);
    std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::~vector
              ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
               &local_258);
    std::vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_>::~vector
              ((vector<lf::refinement::ParentInfo,_std::allocator<lf::refinement::ParentInfo>_> *)
               &local_238);
    peVar1 = (base_mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar3 = (*peVar1->_vptr_Mesh[3])(peVar1,1);
    this_02 = local_1f0;
    local_238._M_dataplus._M_p = local_238._M_dataplus._M_p & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_1b8,(ulong)uVar3,(bool *)&local_238,
               (allocator_type *)&local_258);
    std::
    vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
    ::emplace_back<std::vector<bool,std::allocator<bool>>>
              (this_02,(vector<bool,_std::allocator<bool>_> *)local_1b8);
    if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b8._0_8_,(long)pPStack_198 - local_1b8._0_8_);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Implemented only for 2D meshes",0x1e);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,"base_mesh->DimMesh() == 2","");
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_238,&local_258,0x26,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,(ulong)(local_238.field_2._M_allocated_capacity + 1))
    ;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"this code should not be reached");
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

MeshHierarchy::MeshHierarchy(const std::shared_ptr<mesh::Mesh> &base_mesh,
                             std::unique_ptr<mesh::MeshFactory> mesh_factory)
    : mesh_factory_(std::move(mesh_factory)) {
  LF_VERIFY_MSG(base_mesh, "No valid mesh supplied");
  LF_VERIFY_MSG(base_mesh->DimMesh() == 2, "Implemented only for 2D meshes");
  // Set coarsest mesh
  meshes_.push_back(base_mesh);
  {
    // Refinement edge has to be set for edges
    refinement_edges_.emplace_back(base_mesh->NumEntities(0), idx_nil);
    for (const mesh::Entity *cell : base_mesh->Entities(0)) {
      const lf::base::glb_idx_t cell_index = base_mesh->Index(*cell);
      if (cell->RefEl() == lf::base::RefEl::kTria()) {
        (refinement_edges_.back())[cell_index] = LongestEdge(*cell);
      }
    }  // end loop over cells

    // Setting up child information
    std::vector<CellChildInfo> cell_child_info(base_mesh->NumEntities(0));
    std::vector<EdgeChildInfo> edge_child_info(base_mesh->NumEntities(1));
    std::vector<PointChildInfo> point_child_info(base_mesh->NumEntities(2));
    cell_child_infos_.push_back(std::move(cell_child_info));
    edge_child_infos_.push_back(std::move(edge_child_info));
    point_child_infos_.push_back(std::move(point_child_info));
  }
  {
    // No parents for entities on the coarsest level
    std::vector<ParentInfo> cell_parent_info(base_mesh->NumEntities(0));
    std::vector<ParentInfo> edge_parent_info(base_mesh->NumEntities(1));
    std::vector<ParentInfo> point_parent_info(base_mesh->NumEntities(2));
    parent_infos_.push_back({std::move(cell_parent_info),
                             std::move(edge_parent_info),
                             std::move(point_parent_info)});
  }
  edge_marked_.push_back(
      std::move(std::vector<bool>(base_mesh->NumEntities(1), false)));
}